

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::Fail
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this,HRESULT error)

{
  bool bVar1;
  CharCount pos;
  CharCount encodedPos;
  ParseError *this_00;
  HRESULT error_local;
  Parser<UTF8EncodingPolicyBase<false>,_false> *this_local;
  
  this_00 = (ParseError *)__cxa_allocate_exception(0x10);
  bVar1 = this->inBody;
  pos = Pos(this);
  encodedPos = Chars<unsigned_char>::OSB(this->next,this->input);
  ParseError::ParseError(this_00,(bool)(bVar1 & 1),pos,encodedPos,error);
  __cxa_throw(this_00,&ParseError::typeinfo,0);
}

Assistant:

void Parser<P, IsLiteral>::Fail(HRESULT error)
    {
        throw ParseError(inBody, Pos(), Chars<EncodedChar>::OSB(next, input), error);
    }